

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_features.c
# Opt level: O2

LY_ERR lys_compile_iffeature(ly_ctx *ctx,lysp_qname *qname,lysc_iffeature *iff)

{
  long lVar1;
  char cVar2;
  char cVar3;
  char *pcVar4;
  ushort *puVar5;
  lysp_feature **pplVar6;
  bool bVar7;
  bool bVar8;
  lysc_iffeature *plVar9;
  uint8_t uVar10;
  ushort **ppuVar11;
  long *plVar12;
  uint8_t *puVar13;
  lysp_feature *plVar14;
  char *pcVar15;
  byte bVar16;
  LY_ERR LVar17;
  long lVar18;
  size_t pos;
  char *pcVar19;
  long lVar20;
  long local_80;
  ulong local_68;
  iff_stack local_58;
  long local_40;
  lysc_iffeature *local_38;
  
  pcVar4 = qname->str;
  local_58.size = 0;
  local_58.index = 0;
  if (pcVar4 == (char *)0x0) {
    __assert_fail("c",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_features.c"
                  ,0x146,
                  "LY_ERR lys_compile_iffeature(const struct ly_ctx *, const struct lysp_qname *, struct lysc_iffeature *)"
                 );
  }
  local_40 = 1;
  lVar20 = 0;
  lVar18 = 0;
  bVar8 = false;
  bVar7 = false;
  local_80 = 0;
  local_68 = 0;
  local_38 = iff;
  do {
    plVar9 = local_38;
    cVar2 = pcVar4[lVar20];
    if (cVar2 == '(') {
      lVar18 = lVar18 + 1;
LAB_00150598:
      bVar7 = true;
    }
    else if (cVar2 == ')') {
      lVar18 = lVar18 + -1;
    }
    else {
      if (cVar2 == '\0') break;
      ppuVar11 = __ctype_b_loc();
      puVar5 = *ppuVar11;
      if ((*(byte *)((long)puVar5 + (long)cVar2 * 2 + 1) & 0x20) != 0) goto LAB_00150598;
      pcVar15 = pcVar4 + lVar20;
      if (cVar2 == 'n') {
        if ((pcVar15[1] == 'o') && (bVar16 = 3, pcVar15[2] == 't')) goto LAB_001505c7;
LAB_001505f7:
        local_80 = local_80 + 1;
        bVar8 = false;
      }
      else {
        if (cVar2 != 'o') {
          if (((cVar2 == 'a') && (pcVar15[1] == 'n')) && (bVar16 = 3, pcVar15[2] == 'd'))
          goto LAB_001505c7;
          goto LAB_001505f7;
        }
        bVar16 = 2;
        if (pcVar15[1] != 'r') goto LAB_001505f7;
LAB_001505c7:
        lVar20 = lVar20 + (ulong)bVar16;
        pcVar19 = pcVar4 + lVar20;
        do {
          cVar3 = *pcVar19;
          if ((long)cVar3 == 0) {
            pcVar15 = "Invalid value \"%s\" of if-feature - unexpected end of expression.";
            goto LAB_00150736;
          }
          pcVar19 = pcVar19 + 1;
        } while ((*(byte *)((long)puVar5 + (long)cVar3 * 2 + 1) & 0x20) != 0);
        if ((*(byte *)((long)puVar5 + (long)pcVar4[lVar20] * 2 + 1) & 0x20) == 0) goto LAB_001505f7;
        if (cVar2 == 'n') {
          bVar8 = !bVar8;
          if (!bVar8) {
            local_68 = local_68 - 2;
          }
        }
        else {
          if (local_40 != local_80) {
            ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid value \"%s\" of if-feature - missing feature/expression before \"%.*s\" operation."
                    ,pcVar4,(ulong)bVar16,pcVar15);
            return LY_EVALID;
          }
          local_40 = local_80 + 1;
          bVar8 = false;
        }
      }
      local_68 = local_68 + 1;
      while (bVar16 = pcVar4[lVar20],
            (*(byte *)((long)puVar5 + (long)(char)bVar16 * 2 + 1) & 0x20) == 0) {
        if ((bVar16 < 0x2a) && ((0x30000000001U >> ((ulong)(uint)bVar16 & 0x3f) & 1) != 0)) {
          lVar20 = lVar20 + -1;
          break;
        }
        lVar20 = lVar20 + 1;
      }
    }
    lVar20 = lVar20 + 1;
  } while( true );
  if (lVar18 != 0) {
    pcVar15 = "Invalid value \"%s\" of if-feature - non-matching opening and closing parentheses.";
LAB_00150736:
    ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX_YANG,pcVar15,pcVar4);
    return LY_EVALID;
  }
  if (local_40 != local_80) {
    pcVar15 = 
    "Invalid value \"%s\" of if-feature - number of features in expression does not match the required number of operands for the operations."
    ;
    goto LAB_00150736;
  }
  if (((bVar7) || (1 < local_68)) && (qname->mod->version != '\x02')) {
    pcVar15 = "Invalid value \"%s\" of if-feature - YANG 1.1 expression in YANG 1.0 module.";
    goto LAB_00150736;
  }
  pplVar6 = local_38->features;
  if (pplVar6 == (lysp_feature **)0x0) {
    plVar12 = (long *)calloc(1,local_80 * 8 + 8);
    if (plVar12 == (long *)0x0) goto LAB_00150809;
    lVar18 = 0;
  }
  else {
    plVar12 = (long *)realloc(pplVar6 + -1,((long)&pplVar6[-1]->name + local_80) * 8 + 8);
    if (plVar12 == (long *)0x0) {
LAB_00150809:
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_iffeature");
      return LY_EMEM;
    }
    lVar18 = *plVar12;
  }
  plVar9->features = (lysp_feature **)(plVar12 + 1);
  memset(plVar12 + lVar18 + 1,0,local_80 * 8);
  puVar13 = (uint8_t *)calloc(((local_68 >> 2) + 1) - (ulong)((local_68 & 3) == 0),1);
  plVar9->expr = puVar13;
  local_58.stack = (uint8_t *)malloc(local_68);
  if (puVar13 == (uint8_t *)0x0 || local_58.stack == (uint8_t *)0x0) {
    LVar17 = LY_EMEM;
    ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_iffeature");
  }
  else {
    local_58.size = local_68;
    local_80 = local_80 + -1;
    pos = local_68 - 1;
LAB_0015084c:
    lVar18 = lVar20;
    if (0 < lVar18) {
      lVar20 = lVar18 + -1;
      cVar2 = pcVar4[lVar20];
      if (cVar2 == ')') {
        iff_stack_push(&local_58,'\b');
      }
      else if (cVar2 == '(') {
        while (uVar10 = iff_stack_pop(&local_58), uVar10 != '\b') {
          iff_setop(plVar9->expr,uVar10,pos);
          pos = pos - 1;
        }
      }
      else {
        ppuVar11 = __ctype_b_loc();
        puVar5 = *ppuVar11;
        if ((*(byte *)((long)puVar5 + (long)cVar2 * 2 + 1) & 0x20) == 0) {
          for (; -1 < lVar20; lVar20 = lVar20 + -1) {
            if (((long)pcVar4[lVar20] == 0x28) || ((puVar5[pcVar4[lVar20]] & 0x2000) != 0))
            goto LAB_001508de;
          }
          lVar20 = -1;
LAB_001508de:
          lVar1 = lVar20 + 1;
          pcVar15 = pcVar4 + lVar20 + 1;
          cVar2 = *pcVar15;
          if (cVar2 == 'a') {
            if (((pcVar4[lVar20 + 2] == 'n') && (pcVar4[lVar20 + 3] == 'd')) &&
               ((*(byte *)((long)puVar5 + (long)pcVar4[lVar20 + 4] * 2 + 1) & 0x20) != 0)) {
              while ((local_58.index != 0 && (local_58.stack[local_58.index - 1] < 2))) {
                uVar10 = iff_stack_pop(&local_58);
                iff_setop(plVar9->expr,uVar10,pos);
                pos = pos - 1;
              }
              iff_stack_push(&local_58,'\x01');
              lVar20 = lVar1;
              goto LAB_0015084c;
            }
          }
          else if (cVar2 == 'o') {
            if ((pcVar4[lVar20 + 2] == 'r') &&
               ((*(byte *)((long)puVar5 + (long)pcVar4[lVar20 + 3] * 2 + 1) & 0x20) != 0)) {
              while ((local_58.index != 0 && (local_58.stack[local_58.index - 1] < 3))) {
                uVar10 = iff_stack_pop(&local_58);
                iff_setop(plVar9->expr,uVar10,pos);
                pos = pos - 1;
              }
              iff_stack_push(&local_58,'\x02');
              lVar20 = lVar1;
              goto LAB_0015084c;
            }
          }
          else if ((((cVar2 == 'n') && (pcVar4[lVar20 + 2] == 'o')) && (pcVar4[lVar20 + 3] == 't'))
                  && ((*(byte *)((long)puVar5 + (long)pcVar4[lVar20 + 4] * 2 + 1) & 0x20) != 0)) {
            if ((local_58.index == 0) || (local_58.stack[local_58.index - 1] != '\0')) {
              iff_stack_push(&local_58,'\0');
              lVar20 = lVar1;
            }
            else {
              iff_stack_pop(&local_58);
              lVar20 = lVar1;
            }
            goto LAB_0015084c;
          }
          iff_setop(plVar9->expr,'\x03',pos);
          plVar14 = lysp_feature_find(qname->mod,pcVar15,lVar18 - lVar1,'\x01');
          if (plVar14 == (lysp_feature *)0x0) {
            ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid value \"%s\" of if-feature - unable to find feature \"%.*s\".",
                    qname->str,lVar18 - lVar1 & 0xffffffff,pcVar15);
            LVar17 = LY_EVALID;
            goto LAB_00150b2a;
          }
          pos = pos - 1;
          plVar9->features[local_80] = plVar14;
          plVar9->features[-1] = (lysp_feature *)((long)&plVar9->features[-1]->name + 1);
          local_80 = local_80 + -1;
          lVar20 = lVar1;
        }
      }
      goto LAB_0015084c;
    }
    while (local_58.index != 0) {
      uVar10 = iff_stack_pop(&local_58);
      iff_setop(plVar9->expr,uVar10,pos);
      pos = pos - 1;
    }
    if ((pos == 0xffffffffffffffff) && (LVar17 = LY_SUCCESS, local_80 == -1)) goto LAB_00150b51;
    ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX_YANG,
            "Invalid value \"%s\" of if-feature - processing error.",qname->str);
    LVar17 = LY_EINT;
  }
LAB_00150b2a:
  if (plVar9->features != (lysp_feature **)0x0) {
    free(plVar9->features + -1);
  }
  plVar9->features = (lysp_feature **)0x0;
  free(plVar9->expr);
  plVar9->expr = (uint8_t *)0x0;
LAB_00150b51:
  local_58.size = 0;
  free(local_58.stack);
  return LVar17;
}

Assistant:

static LY_ERR
lys_compile_iffeature(const struct ly_ctx *ctx, const struct lysp_qname *qname, struct lysc_iffeature *iff)
{
    LY_ERR rc = LY_SUCCESS;
    const char *c = qname->str;
    int64_t i, j;
    int8_t op_len, last_not = 0, checkversion = 0;
    LY_ARRAY_COUNT_TYPE f_size = 0, expr_size = 0, f_exp = 1;
    uint8_t op;
    struct iff_stack stack = {0, 0, NULL};
    struct lysp_feature *f;

    assert(c);

    /* pre-parse the expression to get sizes for arrays, also do some syntax checks of the expression */
    for (i = j = 0; c[i]; i++) {
        if (c[i] == '(') {
            j++;
            checkversion = 1;
            continue;
        } else if (c[i] == ')') {
            j--;
            continue;
        } else if (isspace(c[i])) {
            checkversion = 1;
            continue;
        }

        if (!strncmp(&c[i], "not", op_len = ly_strlen_const("not")) ||
                !strncmp(&c[i], "and", op_len = ly_strlen_const("and")) ||
                !strncmp(&c[i], "or", op_len = ly_strlen_const("or"))) {
            uint64_t spaces;

            for (spaces = 0; c[i + op_len + spaces] && isspace(c[i + op_len + spaces]); spaces++) {}
            if (c[i + op_len + spaces] == '\0') {
                LOGVAL(ctx, LYVE_SYNTAX_YANG, "Invalid value \"%s\" of if-feature - unexpected end of expression.", qname->str);
                return LY_EVALID;
            } else if (!isspace(c[i + op_len])) {
                /* feature name starting with the not/and/or */
                last_not = 0;
                f_size++;
            } else if (c[i] == 'n') { /* not operation */
                if (last_not) {
                    /* double not */
                    expr_size = expr_size - 2;
                    last_not = 0;
                } else {
                    last_not = 1;
                }
            } else { /* and, or */
                if (f_exp != f_size) {
                    LOGVAL(ctx, LYVE_SYNTAX_YANG,
                            "Invalid value \"%s\" of if-feature - missing feature/expression before \"%.*s\" operation.",
                            qname->str, op_len, &c[i]);
                    return LY_EVALID;
                }
                f_exp++;

                /* not a not operation */
                last_not = 0;
            }
            i += op_len;
        } else {
            f_size++;
            last_not = 0;
        }
        expr_size++;

        while (!isspace(c[i])) {
            if (!c[i] || (c[i] == ')') || (c[i] == '(')) {
                i--;
                break;
            }
            i++;
        }
    }
    if (j) {
        /* not matching count of ( and ) */
        LOGVAL(ctx, LYVE_SYNTAX_YANG, "Invalid value \"%s\" of if-feature - non-matching opening and closing parentheses.",
                qname->str);
        return LY_EVALID;
    }
    if (f_exp != f_size) {
        /* features do not match the needed arguments for the logical operations */
        LOGVAL(ctx, LYVE_SYNTAX_YANG, "Invalid value \"%s\" of if-feature - number of features in expression does not match "
                "the required number of operands for the operations.", qname->str);
        return LY_EVALID;
    }

    if (checkversion || (expr_size > 1)) {
        /* check that we have 1.1 module */
        if (qname->mod->version != LYS_VERSION_1_1) {
            LOGVAL(ctx, LYVE_SYNTAX_YANG, "Invalid value \"%s\" of if-feature - YANG 1.1 expression in YANG 1.0 module.",
                    qname->str);
            return LY_EVALID;
        }
    }

    /* allocate the memory */
    LY_ARRAY_CREATE_RET(ctx, iff->features, f_size, LY_EMEM);
    iff->expr = calloc((j = (expr_size / IFF_RECORDS_IN_BYTE) + ((expr_size % IFF_RECORDS_IN_BYTE) ? 1 : 0)), sizeof *iff->expr);
    stack.stack = malloc(expr_size * sizeof *stack.stack);
    LY_CHECK_ERR_GOTO(!stack.stack || !iff->expr, LOGMEM(ctx); rc = LY_EMEM, cleanup);

    stack.size = expr_size;
    f_size--; expr_size--; /* used as indexes from now */

    for (i--; i >= 0; i--) {
        if (c[i] == ')') {
            /* push it on stack */
            iff_stack_push(&stack, LYS_IFF_RP);
            continue;
        } else if (c[i] == '(') {
            /* pop from the stack into result all operators until ) */
            while ((op = iff_stack_pop(&stack)) != LYS_IFF_RP) {
                iff_setop(iff->expr, op, expr_size--);
            }
            continue;
        } else if (isspace(c[i])) {
            continue;
        }

        /* end of operator or operand -> find beginning and get what is it */
        j = i + 1;
        while (i >= 0 && !isspace(c[i]) && c[i] != '(') {
            i--;
        }
        i++; /* go back by one step */

        if (!strncmp(&c[i], "not", ly_strlen_const("not")) && isspace(c[i + ly_strlen_const("not")])) {
            if (stack.index && (stack.stack[stack.index - 1] == LYS_IFF_NOT)) {
                /* double not */
                iff_stack_pop(&stack);
            } else {
                /* not has the highest priority, so do not pop from the stack
                 * as in case of AND and OR */
                iff_stack_push(&stack, LYS_IFF_NOT);
            }
        } else if (!strncmp(&c[i], "and", ly_strlen_const("and")) && isspace(c[i + ly_strlen_const("and")])) {
            /* as for OR - pop from the stack all operators with the same or higher
             * priority and store them to the result, then push the AND to the stack */
            while (stack.index && stack.stack[stack.index - 1] <= LYS_IFF_AND) {
                op = iff_stack_pop(&stack);
                iff_setop(iff->expr, op, expr_size--);
            }
            iff_stack_push(&stack, LYS_IFF_AND);
        } else if (!strncmp(&c[i], "or", 2) && isspace(c[i + 2])) {
            while (stack.index && stack.stack[stack.index - 1] <= LYS_IFF_OR) {
                op = iff_stack_pop(&stack);
                iff_setop(iff->expr, op, expr_size--);
            }
            iff_stack_push(&stack, LYS_IFF_OR);
        } else {
            /* feature name, length is j - i */

            /* add it to the expression */
            iff_setop(iff->expr, LYS_IFF_F, expr_size--);

            /* now get the link to the feature definition */
            f = lysp_feature_find(qname->mod, &c[i], j - i, 1);
            if (!f) {
                LOGVAL(ctx, LYVE_SYNTAX_YANG, "Invalid value \"%s\" of if-feature - unable to find feature \"%.*s\".",
                        qname->str, (int)(j - i), &c[i]);
                rc = LY_EVALID;
                goto cleanup;
            }
            iff->features[f_size] = f;
            LY_ARRAY_INCREMENT(iff->features);
            f_size--;
        }
    }
    while (stack.index) {
        op = iff_stack_pop(&stack);
        iff_setop(iff->expr, op, expr_size--);
    }

    if (++expr_size || ++f_size) {
        /* not all expected operators and operands found */
        LOGVAL(ctx, LYVE_SYNTAX_YANG, "Invalid value \"%s\" of if-feature - processing error.", qname->str);
        rc = LY_EINT;
    }

cleanup:
    if (rc) {
        LY_ARRAY_FREE(iff->features);
        iff->features = NULL;
        free(iff->expr);
        iff->expr = NULL;
    }
    iff_stack_clean(&stack);
    return rc;
}